

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ParquetUnionData::ParquetUnionData(ParquetUnionData *this,OpenFileInfo *file_p)

{
  OpenFileInfo local_40;
  
  OpenFileInfo::OpenFileInfo(&local_40,file_p);
  BaseUnionData::BaseUnionData(&this->super_BaseUnionData,&local_40);
  OpenFileInfo::~OpenFileInfo(&local_40);
  (this->super_BaseUnionData)._vptr_BaseUnionData = (_func_int **)&PTR__ParquetUnionData_027cc5d0;
  (this->options).binary_as_string = false;
  (this->options).file_row_number = false;
  (this->options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->options).debug_use_openssl = true;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options).explicit_cardinality = 0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

explicit ParquetUnionData(OpenFileInfo file_p) : BaseUnionData(std::move(file_p)) {
	}